

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int getIntFromStmt(sqlite3 *db,char *zSql,int *piVal)

{
  int iVar1;
  sqlite3_stmt *in_RDX;
  long in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  int rc;
  sqlite3_stmt *pStmt;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar2;
  sqlite3_stmt *pStmt_00;
  
  pStmt_00 = *(sqlite3_stmt **)(in_FS_OFFSET + 0x28);
  iVar2 = 7;
  if ((in_RSI != 0) &&
     (iVar2 = sqlite3_prepare_v2((sqlite3 *)0x0,in_RDI,(int)((ulong)in_RSI >> 0x20),
                                 (sqlite3_stmt **)in_RDX,
                                 (char **)CONCAT44(7,in_stack_ffffffffffffffd0)), iVar2 == 0)) {
    iVar1 = sqlite3_step(pStmt_00);
    if (iVar1 == 100) {
      iVar2 = sqlite3_column_int((sqlite3_stmt *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                                 in_stack_ffffffffffffffcc);
      *(int *)in_RDX = iVar2;
    }
    iVar2 = sqlite3_finalize(in_RDX);
  }
  if (*(sqlite3_stmt **)(in_FS_OFFSET + 0x28) != pStmt_00) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

static int getIntFromStmt(sqlite3 *db, const char *zSql, int *piVal){
  int rc = SQLITE_NOMEM;
  if( zSql ){
    sqlite3_stmt *pStmt = 0;
    rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, 0);
    if( rc==SQLITE_OK ){
      if( SQLITE_ROW==sqlite3_step(pStmt) ){
        *piVal = sqlite3_column_int(pStmt, 0);
      }
      rc = sqlite3_finalize(pStmt);
    }
  }
  return rc;
}